

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O1

Position * __thiscall
iDynTree::Position::operator-(Position *__return_storage_ptr__,Position *this,Position *other)

{
  undefined1 auVar1 [16];
  double dVar2;
  Position *result_1;
  Position result;
  Position local_38;
  
  Position(&local_38);
  local_38.super_Vector3.m_data[0]._0_4_ = *(undefined4 *)(other->super_Vector3).m_data;
  local_38.super_Vector3.m_data[1]._0_4_ = *(undefined4 *)((other->super_Vector3).m_data + 1);
  local_38.super_Vector3.m_data[0]._4_4_ =
       *(uint *)((long)(other->super_Vector3).m_data + 4) ^ 0x80000000;
  local_38.super_Vector3.m_data[1]._4_4_ =
       *(uint *)((long)(other->super_Vector3).m_data + 0xc) ^ 0x80000000;
  local_38.super_Vector3.m_data[2] = -(other->super_Vector3).m_data[2];
  Position(__return_storage_ptr__);
  dVar2 = (this->super_Vector3).m_data[1] +
          (double)CONCAT44(local_38.super_Vector3.m_data[1]._4_4_,
                           local_38.super_Vector3.m_data[1]._0_4_);
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = (this->super_Vector3).m_data[0] +
                 (double)CONCAT44(local_38.super_Vector3.m_data[0]._4_4_,
                                  local_38.super_Vector3.m_data[0]._0_4_);
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])(__return_storage_ptr__->super_Vector3).m_data = auVar1;
  (__return_storage_ptr__->super_Vector3).m_data[2] =
       (this->super_Vector3).m_data[2] + local_38.super_Vector3.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

Position Position::operator-(const Position& other) const
    {
        return compose(*this,inverse(other));
    }